

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O3

int ECDSA_SIG_set0(ECDSA_SIG *sig,BIGNUM *r,BIGNUM *s)

{
  if (s != (BIGNUM *)0x0 && r != (BIGNUM *)0x0) {
    BN_free((BIGNUM *)sig->r);
    BN_free((BIGNUM *)sig->s);
    sig->r = r;
    sig->s = s;
  }
  return (uint)(s != (BIGNUM *)0x0 && r != (BIGNUM *)0x0);
}

Assistant:

int ECDSA_SIG_set0(ECDSA_SIG *sig, BIGNUM *r, BIGNUM *s) {
  if (r == NULL || s == NULL) {
    return 0;
  }
  BN_free(sig->r);
  BN_free(sig->s);
  sig->r = r;
  sig->s = s;
  return 1;
}